

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

ProcessorInstanceRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
          (PoolAllocator *this,Context *args,ProcessorInstance *args_1)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x38);
  AST::ProcessorInstanceRef::ProcessorInstanceRef((ProcessorInstanceRef *)&pPVar1->item,args,args_1)
  ;
  pPVar1->destructor =
       allocate<soul::AST::ProcessorInstanceRef,_soul::AST::Context_&,_soul::AST::ProcessorInstance_&>
       ::anon_class_1_0_00000001::__invoke;
  return (ProcessorInstanceRef *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }